

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O2

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  FILE *__stream;
  int iVar1;
  const_iterator cVar2;
  Value *pVVar3;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  undefined4 in_register_00000034;
  long lVar4;
  char **in_R8;
  code *pcVar5;
  long *plVar6;
  string_view format_str;
  undefined1 local_102;
  undefined1 local_101;
  char *local_100;
  string local_f8 [6];
  
  lVar4 = CONCAT44(in_register_00000034,__fd);
  if (accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_);
    __addr = extraout_RDX;
    if (iVar1 != 0) {
      memcpy(local_f8,&DAT_001ae0e8,0xd8);
      in_R8 = &local_100;
      std::
      _Hashtable<int,std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,std::__cxx11::string_const&)>,std::allocator<std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,std::__cxx11::string_const&)>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _Hashtable<std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,std::__cxx11::string_const&)>const*>
                ((_Hashtable<int,std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,std::__cxx11::string_const&)>,std::allocator<std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,std::__cxx11::string_const&)>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_,local_f8,
                 &stack0xffffffffffffffe0,0,in_R8,&local_101,&local_102);
      __cxa_atexit(std::
                   unordered_map<int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                   ::~unordered_map,&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_);
      __addr = extraout_RDX_00;
    }
  }
  (**(code **)(**(long **)(lVar4 + 0x48) + 0x10))(*(long **)(lVar4 + 0x48),this,__addr);
  pVVar3 = this->result_;
  local_f8[0]._M_dataplus._M_p._0_4_ = (uint)*(ushort *)(lVar4 + 0x40);
  cVar2 = std::
          _Hashtable<int,_std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_._M_h,(key_type *)local_f8);
  __stream = _stderr;
  if (cVar2.
      super__Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
      ._M_cur != (__node_type *)0x0) {
    pcVar5 = *(code **)((long)cVar2.
                              super__Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
                              ._M_cur + 0x10);
    plVar6 = (long *)((long)&(this->super_ASTVisitor)._vptr_ASTVisitor +
                     *(long *)((long)cVar2.
                                     super__Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
                                     ._M_cur + 0x18));
    if (((ulong)pcVar5 & 1) != 0) {
      pcVar5 = *(code **)(pcVar5 + *plVar6 + -1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f8,"",(allocator<char> *)&local_100);
    pVVar3 = (Value *)(*pcVar5)(plVar6,pVVar3,local_f8);
    this->result_ = pVVar3;
    iVar1 = std::__cxx11::string::~string((string *)local_f8);
    return iVar1;
  }
  local_100 = mnemonic(*(Opcode *)(lVar4 + 0x40));
  format_str.size_ = (size_t)&local_100;
  format_str.data_ = (char *)0x2f;
  fmt::v5::format<char_const*>
            (local_f8,(v5 *)"Unsupported unary expression {} in IRGenerator.",format_str,in_R8);
  fprintf(__stream,"%s\n",
          CONCAT44(local_f8[0]._M_dataplus._M_p._4_4_,(uint)local_f8[0]._M_dataplus._M_p));
  std::__cxx11::string::~string((string *)local_f8);
  abort();
}

Assistant:

void IRGenerator::accept(UnaryExpr& expr) {
  static const std::unordered_map<
      int /*Opcode*/,
      Value* (IRGenerator::*)(Value*, const std::string&)> ops =
      {{Opcode::N2S, &IRGenerator::createN2S},
       {Opcode::P2S, &IRGenerator::createP2S},
       {Opcode::C2S, &IRGenerator::createC2S},
       {Opcode::R2S, &IRGenerator::createR2S},
       {Opcode::S2N, &IRGenerator::createS2N},
       {Opcode::NNEG, &IRGenerator::createNeg},
       {Opcode::NNOT, &IRGenerator::createNot},
       {Opcode::BNOT, &IRGenerator::createBNot},
       {Opcode::SLEN, &IRGenerator::createSLen}, };

  Value* rhs = codegen(expr.subExpr());

  auto i = ops.find(expr.op());
  FLOW_ASSERT(i != ops.end(), fmt::format("Unsupported unary expression {} in IRGenerator.", mnemonic(expr.op())));
  result_ = (this->*i->second)(rhs, "");
}